

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageCommand.cxx
# Opt level: O1

bool __thiscall cmCTestCoverageCommand::CheckArgumentValue(cmCTestCoverageCommand *this,string *arg)

{
  int iVar1;
  uint uVar2;
  pointer ppcVar3;
  char *pcVar4;
  cmMakefile *this_00;
  cmCTest *this_01;
  size_t sVar5;
  ostream *poVar6;
  undefined1 auStack_1c8 [8];
  string sStack_1c0;
  undefined1 auStack_1a0 [376];
  
  if ((this->super_cmCTestHandlerCommand).ArgumentDoing == 3) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->Labels,arg);
    return true;
  }
  iVar1 = (this->super_cmCTestHandlerCommand).ArgumentDoing;
  if (iVar1 == 2) {
    (this->super_cmCTestHandlerCommand).ArgumentDoing = 0;
    uVar2 = (this->super_cmCTestHandlerCommand).ArgumentIndex;
    ppcVar3 = (this->super_cmCTestHandlerCommand).Values.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppcVar3[uVar2] == (char *)0x0) {
      ppcVar3[uVar2] = (arg->_M_dataplus)._M_p;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a0,"Set ",4);
      pcVar4 = (this->super_cmCTestHandlerCommand).Arguments.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar2];
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)auStack_1c8 + (int)*(_func_int **)(auStack_1a0._0_8_ + -0x18) + 0x28);
      }
      else {
        sVar5 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a0,pcVar4,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a0," to ",4);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)auStack_1a0,(arg->_M_dataplus)._M_p,arg->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      this_01 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(this_01,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                   ,0xd0,sStack_1c0._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_1c0._M_dataplus._M_p != &sStack_1c0.field_2) {
        operator_delete(sStack_1c0._M_dataplus._M_p,sStack_1c0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_1a0,"Called with more than one value for ",0x24);
      pcVar4 = (this->super_cmCTestHandlerCommand).Arguments.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar2];
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)auStack_1c8 + (int)*(_func_int **)(auStack_1a0._0_8_ + -0x18) + 0x28);
      }
      else {
        sVar5 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a0,pcVar4,sVar5);
      }
      this_00 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&sStack_1c0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_1c0._M_dataplus._M_p != &sStack_1c0.field_2) {
        operator_delete(sStack_1c0._M_dataplus._M_p,sStack_1c0.field_2._M_allocated_capacity + 1);
      }
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 1;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1a0);
    std::ios_base::~ios_base((ios_base *)(auStack_1a0 + 0x70));
  }
  return iVar1 == 2;
}

Assistant:

bool cmCTestCoverageCommand::CheckArgumentValue(std::string const& arg)
{
  // Handle states specific to this command.
  if(this->ArgumentDoing == ArgumentDoingLabels)
    {
    this->Labels.insert(arg);
    return true;
    }

  // Look for other arguments.
  return this->Superclass::CheckArgumentValue(arg);
}